

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_font.cpp
# Opt level: O2

ON_Font * __thiscall
ON_FontList::FontFromQuartetProperties
          (ON_FontList *this,wchar_t *quartet_name,bool bBold,bool bItalic)

{
  ON_FontFaceQuartet *pOVar1;
  ulong uVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  ON_ClassArray<ON_FontFaceQuartet> *this_00;
  long lVar6;
  ulong uVar7;
  long lVar8;
  ON_Font *pOVar9;
  ON_FontFaceQuartet qname;
  ON_wString OStack_68;
  long local_60;
  ON_FontFaceQuartet local_58;
  
  ON_FontFaceQuartet::ON_FontFaceQuartet
            (&local_58,quartet_name,(ON_Font *)0x0,(ON_Font *)0x0,(ON_Font *)0x0,(ON_Font *)0x0);
  ON_wString::ON_wString(&OStack_68,&local_58.m_quartet_name);
  bVar3 = ON_wString::IsEmpty(&OStack_68);
  ON_wString::~ON_wString(&OStack_68);
  if (!bVar3) {
    this_00 = QuartetList(this);
    iVar5 = this_00->m_count;
    uVar4 = ON_ClassArray<ON_FontFaceQuartet>::BinarySearch
                      (this_00,&local_58,ON_FontFaceQuartet::CompareQuartetName);
    if ((int)uVar4 < iVar5 && -1 < (int)uVar4) {
      uVar2 = (ulong)uVar4;
      lVar6 = (ulong)uVar4 * 0x28;
      local_60 = (long)iVar5;
      do {
        uVar7 = uVar2;
        if ((long)uVar7 < 1) {
          iVar5 = 0;
          goto LAB_0049e227;
        }
        iVar5 = ON_FontFaceQuartet::CompareQuartetName
                          (&local_58,
                           (ON_FontFaceQuartet *)
                           ((long)&this_00->m_a[-1].m_quartet_name.m_s + lVar6));
        uVar2 = uVar7 - 1;
        lVar6 = lVar6 + -0x28;
      } while (iVar5 == 0);
      iVar5 = (int)uVar7;
LAB_0049e227:
      if ((long)uVar7 < 1) {
        uVar7 = 0;
      }
      lVar6 = (long)iVar5;
      lVar8 = (long)(int)uVar7 * 0x28;
      do {
        pOVar1 = this_00->m_a;
        iVar5 = ON_FontFaceQuartet::CompareQuartetName
                          (&local_58,
                           (ON_FontFaceQuartet *)((long)&(pOVar1->m_quartet_name).m_s + lVar8));
        if (iVar5 != 0) break;
        pOVar9 = *(ON_Font **)
                  ((long)&pOVar1->m_regular +
                  lVar8 + (ulong)((uint)bItalic * 0x10 + (uint)bBold * 8));
        if (pOVar9 != (ON_Font *)0x0) goto LAB_0049e283;
        lVar6 = lVar6 + 1;
        lVar8 = lVar8 + 0x28;
      } while (lVar6 < local_60);
    }
  }
  pOVar9 = (ON_Font *)0x0;
LAB_0049e283:
  ON_wString::~ON_wString(&local_58.m_quartet_name);
  return pOVar9;
}

Assistant:

const ON_Font* ON_FontList::FontFromQuartetProperties(
  const wchar_t* quartet_name,
  bool bBold,
  bool bItalic
) const
{
  const ON_FontFaceQuartet qname(quartet_name, nullptr, nullptr, nullptr, nullptr);
  if (qname.QuartetName().IsEmpty())
    return nullptr;

  const ON_ClassArray< ON_FontFaceQuartet >& quartet_list = ON_FontList::QuartetList();
  const int quartet_list_count = quartet_list.Count();
  int i = quartet_list.BinarySearch(&qname, ON_FontFaceQuartet::CompareQuartetName);
  if (i < 0 || i >= quartet_list_count)
    return nullptr;

  while (i > 0 && 0 == ON_FontFaceQuartet::CompareQuartetName(&qname, &quartet_list[i - 1]))
    i--;
  
  do
  {
    const ON_FontFaceQuartet& q = quartet_list[i];
    if (0 != ON_FontFaceQuartet::CompareQuartetName(&qname, &q))
      break;
    const ON_Font* font = q.Face(bBold, bItalic);
    if (nullptr != font)
      return font;
    i++;
  } while (i < quartet_list_count);

  return nullptr;
}